

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O0

int_t mc64ud_(int_t *id,int_t *mod,int_t *n,int_t *irn,int_t *lirn,int_t *ip,int_t *lenc,int_t *fc,
             int_t *iperm,int_t *num,int_t *numx,int_t *pr,int_t *arp,int_t *cv,int_t *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_88;
  int local_84;
  int_t last;
  int_t jord;
  int_t num2;
  int_t num1;
  int_t num0;
  int_t nfc;
  int_t in2;
  int_t in1;
  int_t id1;
  int_t id0;
  int_t kk;
  int_t ii;
  int_t j1;
  int_t k;
  int_t j;
  int_t i__;
  int_t i__4;
  int_t i__3;
  int_t i__2;
  int_t i__1;
  int_t *ip_local;
  int_t *lirn_local;
  int_t *irn_local;
  int_t *n_local;
  int_t *mod_local;
  int_t *id_local;
  
  if (*id == 1) {
    iVar1 = *n;
    for (k = 1; k <= iVar1; k = k + 1) {
      cv[(long)k + -1] = 0;
      arp[(long)k + -1] = 0;
    }
    jord = *n;
    last = *n;
  }
  else {
    if (*mod == 1) {
      iVar1 = *n;
      for (k = 1; k <= iVar1; k = k + 1) {
        arp[(long)k + -1] = 0;
      }
    }
    jord = *numx;
    last = *n - *numx;
  }
  iVar1 = *num;
  num1 = 0;
  iVar2 = *id;
  iVar3 = *n;
  iVar4 = *n;
  local_84 = iVar1;
LAB_00123144:
  do {
    local_84 = local_84 + 1;
    if (iVar4 < local_84) {
      local_88 = *n;
      goto LAB_00123480;
    }
    iVar6 = (iVar2 + -1) * iVar3 + local_84;
    j1 = fc[(long)(local_84 - iVar1) + -1];
    pr[(long)j1 + -1] = -1;
    for (ii = 1; ii <= local_84; ii = ii + 1) {
      if (arp[(long)j1 + -1] < lenc[(long)j1 + -1]) {
        for (id0 = ip[(long)j1 + -1] + arp[(long)j1 + -1];
            id0 <= ip[(long)j1 + -1] + lenc[(long)j1 + -1] + -1; id0 = id0 + 1) {
          k = irn[(long)id0 + -1];
          if (iperm[(long)k + -1] == 0) goto LAB_001233a2;
        }
        arp[(long)j1 + -1] = lenc[(long)j1 + -1];
      }
      out[(long)j1 + -1] = lenc[(long)j1 + -1] + -1;
      for (id1 = 1; id1 <= local_84; id1 = id1 + 1) {
        if (-1 < out[(long)j1 + -1]) {
          iVar7 = ip[(long)j1 + -1] + lenc[(long)j1 + -1] + -1;
          for (id0 = iVar7 - out[(long)j1 + -1]; id0 <= iVar7; id0 = id0 + 1) {
            k = irn[(long)id0 + -1];
            if (cv[(long)k + -1] != iVar6) {
              iVar5 = iperm[(long)k + -1];
              cv[(long)k + -1] = iVar6;
              pr[(long)iVar5 + -1] = j1;
              out[(long)j1 + -1] = (iVar7 - id0) + -1;
              j1 = iVar5;
              goto LAB_00123390;
            }
          }
        }
        if (pr[(long)j1 + -1] == -1) {
          num1 = num1 + 1;
          fc[(long)num1 + -1] = j1;
          if (num1 <= last) goto LAB_00123144;
          local_88 = local_84;
          goto LAB_00123480;
        }
        j1 = pr[(long)j1 + -1];
      }
LAB_00123390:
    }
LAB_001233a2:
    iperm[(long)k + -1] = j1;
    arp[(long)j1 + -1] = (id0 - ip[(long)j1 + -1]) + 1;
    *num = *num + 1;
    ii = 1;
    while ((ii <= local_84 && (j1 = pr[(long)j1 + -1], j1 != -1))) {
      id0 = ((ip[(long)j1 + -1] + lenc[(long)j1 + -1]) - out[(long)j1 + -1]) + -2;
      k = irn[(long)id0 + -1];
      iperm[(long)k + -1] = j1;
      ii = ii + 1;
    }
  } while (*num != jord);
  local_88 = local_84;
LAB_00123480:
  iVar2 = *n;
  while (local_84 = local_88 + 1, local_84 <= iVar2) {
    num1 = num1 + 1;
    fc[(long)num1 + -1] = fc[(long)(local_84 - iVar1) + -1];
    local_88 = local_84;
  }
  return 0;
}

Assistant:

int_t mc64ud_(int_t *id, int_t *mod, int_t *n, int_t *
	irn, int_t *lirn, int_t *ip, int_t *lenc, int_t *fc, int_t *
	iperm, int_t *num, int_t *numx, int_t *pr, int_t *arp, 
	int_t *cv, int_t *out)
{
    /* System generated locals */
    int_t i__1, i__2, i__3, i__4;

    /* Local variables */
    int_t i__, j, k, j1, ii, kk, id0, id1, in1, in2, nfc, num0, num1, num2, 
	    jord, last;


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* PR(J) is the previous column to J in the depth first search. */
/*   Array PR is used as workspace in the sorting algorithm. */
/* Elements (I,IPERM(I)) I=1,..,N are entries at the end of the */
/*   algorithm unless N assignments have not been made in which case */
/*   N-NUM pairs (I,IPERM(I)) will not be entries in the matrix. */
/* CV(I) is the most recent loop number (ID+JORD) at which row I */
/*   was visited. */
/* ARP(J) is the number of entries in column J which have been scanned */
/*   when looking for a cheap assignment. */
/* OUT(J) is one less than the number of entries in column J which have */
/*   not been scanned during one pass through the main loop. */
/* NUMX is maximum possible size of matching. */
    /* Parameter adjustments */
    --out;
    --cv;
    --arp;
    --pr;
    --iperm;
    --fc;
    --lenc;
    --ip;
    --irn;

    /* Function Body */
    if (*id == 1) {
/* The first call to MC64U/UD. */
/* Initialize CV and ARP; parameters MOD, NUMX are not accessed */
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    cv[i__] = 0;
	    arp[i__] = 0;
/* L5: */
	}
	num1 = *n;
	num2 = *n;
    } else {
/* Not the first call to MC64U/UD. */
/* Re-initialize ARP if entries were deleted since last call to MC64U/UD */
	if (*mod == 1) {
	    i__1 = *n;
	    for (i__ = 1; i__ <= i__1; ++i__) {
		arp[i__] = 0;
/* L8: */
	    }
	}
	num1 = *numx;
	num2 = *n - *numx;
    }
    num0 = *num;
/* NUM0 is size of input matching */
/* NUM1 is maximum possible size of matching */
/* NUM2 is maximum allowed number of unassigned rows/columns */
/* NUM is size of current matching */
/* Quick return if possible */
/*      IF (NUM.EQ.N) GO TO 199 */
/* NFC is number of rows/columns that could not be assigned */
    nfc = 0;
/* Integers ID0+1 to ID0+N are unique numbers for call ID to MC64U/UD, */
/* so 1st call uses 1..N, 2nd call uses N+1..2N, etc */
    id0 = (*id - 1) * *n;
/* Main loop. Each pass round this loop either results in a new */
/* assignment or gives a column with no assignment */
    i__1 = *n;
    for (jord = num0 + 1; jord <= i__1; ++jord) {
/* Each pass uses unique number ID1 */
	id1 = id0 + jord;
/* J is unmatched column */
	j = fc[jord - num0];
	pr[j] = -1;
	i__2 = jord;
	for (k = 1; k <= i__2; ++k) {
/* Look for a cheap assignment */
	    if (arp[j] >= lenc[j]) {
		goto L30;
	    }
	    in1 = ip[j] + arp[j];
	    in2 = ip[j] + lenc[j] - 1;
	    i__3 = in2;
	    for (ii = in1; ii <= i__3; ++ii) {
		i__ = irn[ii];
		if (iperm[i__] == 0) {
		    goto L80;
		}
/* L20: */
	    }
/* No cheap assignment in row */
	    arp[j] = lenc[j];
/* Begin looking for assignment chain starting with row J */
L30:
	    out[j] = lenc[j] - 1;
/* Inner loop.  Extends chain by one or backtracks */
	    i__3 = jord;
	    for (kk = 1; kk <= i__3; ++kk) {
		in1 = out[j];
		if (in1 < 0) {
		    goto L50;
		}
		in2 = ip[j] + lenc[j] - 1;
		in1 = in2 - in1;
/* Forward scan */
		i__4 = in2;
		for (ii = in1; ii <= i__4; ++ii) {
		    i__ = irn[ii];
		    if (cv[i__] == id1) {
			goto L40;
		    }
/* Column J has not yet been accessed during this pass */
		    j1 = j;
		    j = iperm[i__];
		    cv[i__] = id1;
		    pr[j] = j1;
		    out[j1] = in2 - ii - 1;
		    goto L70;
L40:
		    ;
		}
/* Backtracking step. */
L50:
		j1 = pr[j];
		if (j1 == -1) {
/* No augmenting path exists for column J. */
		    ++nfc;
		    fc[nfc] = j;
		    if (nfc > num2) {
/* A matching of maximum size NUM1 is not possible */
			last = jord;
			goto L101;
		    }
		    goto L100;
		}
		j = j1;
/* L60: */
	    }
/* End of dummy loop; this point is never reached */
L70:
	    ;
	}
/* End of dummy loop; this point is never reached */
/* New assignment is made. */
L80:
	iperm[i__] = j;
	arp[j] = ii - ip[j] + 1;
	++(*num);
	i__2 = jord;
	for (k = 1; k <= i__2; ++k) {
	    j = pr[j];
	    if (j == -1) {
		goto L95;
	    }
	    ii = ip[j] + lenc[j] - out[j] - 2;
	    i__ = irn[ii];
	    iperm[i__] = j;
/* L90: */
	}
/* End of dummy loop; this point is never reached */
L95:
	if (*num == num1) {
/* A matching of maximum size NUM1 is found */
	    last = jord;
	    goto L101;
	}

L100:
	;
    }
/* All unassigned columns have been considered */
    last = *n;
/* Now, a transversal is computed or is not possible. */
/* Complete FC before returning. */
L101:
    i__1 = *n;
    for (jord = last + 1; jord <= i__1; ++jord) {
	++nfc;
	fc[nfc] = fc[jord - num0];
/* L110: */
    }
/*  199 RETURN */
    return 0;
}